

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-slicer-opts.cpp
# Opt level: O0

SlicerOptions * parseSlicerOptions(int argc,char **argv,bool requireCrit,bool inputFileRequired)

{
  OptionEnumValue Options;
  OptionEnumValue Options_00;
  OptionEnumValue Options_1;
  OptionEnumValue Options_2;
  OptionEnumValue Options_01;
  OptionEnumValue Options_1_00;
  OptionEnumValue Options_2_00;
  OptionEnumValue Options_3;
  OptionEnumValue Options_4;
  OptionEnumValue Options_5;
  OptionEnumValue Options_6;
  OptionEnumValue Options_02;
  OptionEnumValue Options_1_01;
  OptionEnumValue Options_7;
  bool bVar1;
  string sVar2;
  int iVar3;
  int iVar4;
  CDAlgorithm CVar5;
  AnalysisType AVar6;
  UndefinedFunsBehavior UVar7;
  AnalysisType AVar8;
  SubCommand *pSVar9;
  unsigned_long o;
  byte in_CL;
  char **in_RDX;
  int in_ESI;
  SlicerOptions *in_RDI;
  byte in_R8B;
  LLVMControlDependenceAnalysisOptions *CDAOptions;
  LLVMDataDependenceAnalysisOptions *DDAOptions;
  LLVMPointerAnalysisOptions *PTAOptions;
  LLVMDependenceGraphOptions *dgOptions;
  opt<bool,_false,_llvm::cl::parser<bool>_> criteriaAreNextInstr;
  opt<bool,_false,_llvm::cl::parser<bool>_> cutoffDiverging;
  alias cdaInterprocAlias;
  alias cdAlgAlias;
  opt<dg::ControlDependenceAnalysisOptions::CDAlgorithm,_false,_llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>_>
  cdAlgorithm;
  opt<dg::DataDependenceAnalysisOptions::AnalysisType,_false,_llvm::cl::parser<dg::DataDependenceAnalysisOptions::AnalysisType>_>
  ddaType;
  opt<dg::LLVMPointerAnalysisOptions::AnalysisType,_false,_llvm::cl::parser<dg::LLVMPointerAnalysisOptions::AnalysisType>_>
  ptaType;
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  allocationFuns;
  opt<bool,_false,_llvm::cl::parser<bool>_> preserveDbg;
  opt<bool,_false,_llvm::cl::parser<bool>_> threads;
  opt<bool,_false,_llvm::cl::parser<bool>_> forwardSlicing;
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  entryFunction;
  opt<dg::dda::UndefinedFunsBehavior,_false,_llvm::cl::parser<dg::dda::UndefinedFunsBehavior>_>
  undefinedFunsBehavior;
  opt<unsigned_long,_false,_llvm::cl::parser<unsigned_long>_> ptaFieldSensitivity;
  opt<bool,_false,_llvm::cl::parser<bool>_> icfgCD;
  opt<bool,_false,_llvm::cl::parser<bool>_> cdaPerInstr;
  opt<bool,_false,_llvm::cl::parser<bool>_> interprocCd;
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  preservedFuns;
  opt<bool,_false,_llvm::cl::parser<bool>_> removeSlicingCriteria;
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  legacySecondarySlicingCriteria;
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  legacySlicingCriteria;
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  slicingCriteria;
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  inputFile;
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  outputFile;
  SlicerOptions *options;
  char (*in_stack_ffffffffffffd7a8) [1];
  char (*Val) [5];
  bool *Val_00;
  cat *in_stack_ffffffffffffd7b0;
  cat *Ms_3;
  opt<dg::ControlDependenceAnalysisOptions::CDAlgorithm,_false,_llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>_>
  *this;
  cat *in_stack_ffffffffffffd7b8;
  cat *pcVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  StringRef *in_stack_ffffffffffffd7c0;
  StringRef *pSVar11;
  value_desc *in_stack_ffffffffffffd7c8;
  ValuesClass *pVVar12;
  opt<bool,_false,_llvm::cl::parser<bool>_> *in_stack_ffffffffffffd7d0;
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  desc *Ms_1;
  SlicerOptions *pSVar13;
  char (*in_stack_ffffffffffffd7d8) [20];
  char (*Ms) [15];
  char (*pacVar14) [4];
  opt<unsigned_long,_false,_llvm::cl::parser<unsigned_long>_> *in_stack_ffffffffffffd7e0;
  opt<dg::dda::UndefinedFunsBehavior,_false,_llvm::cl::parser<dg::dda::UndefinedFunsBehavior>_>
  *this_01;
  opt<dg::DataDependenceAnalysisOptions::AnalysisType,_false,_llvm::cl::parser<dg::DataDependenceAnalysisOptions::AnalysisType>_>
  *this_02;
  opt<dg::ControlDependenceAnalysisOptions::CDAlgorithm,_false,_llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>_>
  *this_03;
  char sep;
  string *opt;
  undefined8 uVar15;
  undefined8 uVar16;
  string *allocationFuns_00;
  undefined8 uVar17;
  LLVMDependenceGraphOptions *dgOptions_00;
  undefined8 uVar18;
  size_t sVar19;
  undefined8 uVar20;
  size_t sVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  size_t sVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 in_stack_ffffffffffffd8c0;
  undefined8 in_stack_ffffffffffffd8c8;
  size_t in_stack_ffffffffffffd8d0;
  undefined8 in_stack_ffffffffffffd920;
  undefined8 in_stack_ffffffffffffd928;
  undefined8 in_stack_ffffffffffffd930;
  undefined8 in_stack_ffffffffffffd938;
  size_t in_stack_ffffffffffffd940;
  undefined8 in_stack_ffffffffffffd948;
  undefined8 in_stack_ffffffffffffd950;
  undefined8 in_stack_ffffffffffffd958;
  undefined8 in_stack_ffffffffffffd960;
  size_t in_stack_ffffffffffffd968;
  undefined8 in_stack_ffffffffffffd970;
  undefined8 in_stack_ffffffffffffd978;
  undefined8 in_stack_ffffffffffffd980;
  undefined8 in_stack_ffffffffffffd988;
  LLVMControlDependenceAnalysisOptions *this_04;
  undefined4 in_stack_ffffffffffffd990;
  undefined4 in_stack_ffffffffffffd994;
  undefined8 in_stack_ffffffffffffd9a0;
  undefined8 in_stack_ffffffffffffd9a8;
  undefined4 in_stack_ffffffffffffd9b0;
  undefined4 in_stack_ffffffffffffd9b4;
  size_t in_stack_ffffffffffffd9b8;
  SlicerOptions *pSVar29;
  Offset in_stack_ffffffffffffd9d0;
  undefined8 in_stack_ffffffffffffd9d8;
  size_t in_stack_ffffffffffffd9e0;
  string *this_05;
  char *in_stack_ffffffffffffd9e8;
  size_t in_stack_ffffffffffffd9f0;
  undefined1 in_stack_ffffffffffffd9f8 [24];
  undefined7 in_stack_ffffffffffffda10;
  undefined1 in_stack_ffffffffffffda17;
  StringRef in_stack_ffffffffffffda18;
  undefined1 in_stack_ffffffffffffda28 [15];
  undefined1 in_stack_ffffffffffffda37;
  undefined8 in_stack_ffffffffffffda38;
  StringRef in_stack_ffffffffffffda40;
  StringRef in_stack_ffffffffffffda50;
  OptionEnumValue in_stack_ffffffffffffda60;
  OptionEnumValue in_stack_ffffffffffffda88;
  OptionEnumValue in_stack_ffffffffffffdab0;
  OptionEnumValue in_stack_ffffffffffffdad8;
  OptionEnumValue in_stack_ffffffffffffdb00;
  undefined7 in_stack_ffffffffffffdb28;
  undefined1 in_stack_ffffffffffffdb2f;
  undefined8 in_stack_ffffffffffffdb30;
  StringRef in_stack_ffffffffffffdb38;
  char *in_stack_ffffffffffffdb48;
  OptionEnumValue in_stack_ffffffffffffdb50;
  OptionEnumValue in_stack_ffffffffffffdb78;
  OptionEnumValue in_stack_ffffffffffffdba0;
  OptionEnumValue in_stack_ffffffffffffdbc8;
  cat local_23e8;
  aliasopt local_23e0;
  StringRef local_23d8;
  desc local_23c8 [9];
  cat local_2330;
  aliasopt local_2328;
  StringRef local_2320;
  desc local_2310 [9];
  cat local_2278;
  undefined4 local_226c;
  CDAlgorithm *local_2268;
  undefined4 local_2250;
  undefined4 local_2228;
  undefined4 local_2200;
  undefined4 local_21d8;
  undefined4 local_21b0;
  undefined4 local_2188;
  undefined4 local_2160;
  undefined4 local_2138;
  undefined4 local_2110;
  undefined4 local_20e8;
  undefined4 uStack_20e4;
  LLVMDependenceGraphOptions *pLStack_20e0;
  SlicerOptions *local_20d0;
  char (*pacStack_20c8) [4];
  undefined4 local_20c0;
  undefined4 uStack_20bc;
  string *psStack_20b8;
  bool *local_20a8;
  opt<dg::ControlDependenceAnalysisOptions::CDAlgorithm,_false,_llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>_>
  *poStack_20a0;
  undefined4 local_2098;
  undefined4 uStack_2094;
  StringRef *pSStack_2090;
  ValuesClass *local_2088;
  StringRef local_1fd0;
  desc local_1fc0;
  Option local_1fb0 [600];
  cat local_1d58;
  undefined4 local_1d4c;
  AnalysisType *local_1d48;
  AnalysisType *local_1d40;
  undefined4 local_1d30;
  undefined4 uStack_1d2c;
  StringRef *pSStack_1d28;
  ValuesClass *local_1d20;
  StringRef local_1c68;
  desc local_1c58 [38];
  cat local_19f0;
  undefined4 local_19e4;
  AnalysisType *local_19e0;
  undefined8 uStack_19d0;
  undefined4 local_19c8;
  undefined4 uStack_19c4;
  undefined8 uStack_19c0;
  undefined8 local_19b8;
  desc *local_19b0;
  char (*pacStack_19a8) [4];
  undefined4 local_19a0;
  undefined4 uStack_199c;
  AnalysisType *local_1988;
  undefined4 local_1978;
  undefined4 uStack_1974;
  StringRef *pSStack_1970;
  ValuesClass *local_1968;
  StringRef local_18b0;
  desc local_18a0 [38];
  cat local_1638;
  StringRef local_1630;
  desc local_1620 [16];
  cat local_1518;
  undefined1 local_1509;
  bool *local_1508;
  StringRef local_1500;
  desc local_14f0 [13];
  cat local_1420;
  undefined1 local_1411;
  bool *local_1410;
  StringRef local_1408;
  desc local_13f8 [13];
  cat local_1328;
  undefined1 local_1319;
  bool *local_1318;
  StringRef local_1310;
  desc local_1300 [13];
  cat local_1230;
  char (*local_1228) [5];
  StringRef local_1220;
  desc local_1210 [9];
  string asStack_1180 [120];
  cat local_1108;
  undefined4 local_10fc;
  UndefinedFunsBehavior *local_10f8;
  undefined8 local_10f0;
  undefined8 uStack_10e8;
  undefined4 local_10e0;
  undefined4 uStack_10dc;
  undefined8 uStack_10d8;
  undefined8 local_10d0;
  undefined8 local_10c8;
  undefined8 uStack_10c0;
  undefined4 local_10b8;
  undefined4 uStack_10b4;
  undefined8 uStack_10b0;
  undefined8 local_10a8;
  undefined4 local_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  size_t local_1078;
  undefined4 local_1068;
  undefined4 local_1040;
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1028;
  char (*pacStack_1020) [15];
  undefined4 local_1018;
  undefined4 uStack_1014;
  char (*local_1000) [5];
  cat *pcStack_ff8;
  undefined4 local_ff0;
  undefined4 uStack_fec;
  StringRef *pSStack_fe8;
  ValuesClass *local_fe0;
  StringRef local_f28;
  desc local_f18 [38];
  cat local_cb0;
  unsigned_long *local_ca8;
  StringRef local_ca0;
  value_desc local_c90;
  StringRef local_c80;
  desc local_c70 [13];
  cat local_b98;
  undefined1 local_b89;
  bool *local_b88;
  StringRef local_b80;
  desc local_b70 [13];
  cat local_aa0;
  undefined1 local_a91;
  bool *local_a90;
  StringRef local_a88;
  desc local_a78 [13];
  cat local_9a8;
  undefined1 local_999;
  bool *local_998;
  StringRef local_990;
  desc local_980;
  Option local_970 [192];
  cat local_8b0;
  char (*local_8a8) [1];
  StringRef local_8a0;
  value_desc local_890;
  StringRef local_880;
  desc local_870 [16];
  cat local_768;
  undefined1 local_759;
  bool *local_758;
  StringRef local_750;
  desc local_740 [13];
  cat local_670;
  char (*local_668) [1];
  StringRef local_660;
  value_desc local_650;
  StringRef local_640;
  desc local_630 [9];
  string asStack_5a0 [120];
  cat local_528;
  char (*local_520) [1];
  StringRef local_518;
  value_desc local_508;
  StringRef local_4f8;
  desc local_4e8;
  Option local_4d8 [128];
  string asStack_458 [120];
  cat local_3e0;
  char (*local_3d8) [1];
  StringRef local_3d0;
  value_desc local_3c0;
  StringRef local_3b0;
  desc local_3a0;
  Option local_390 [128];
  string asStack_310 [120];
  cat local_298;
  char (*local_290) [1];
  StringRef local_288;
  desc local_278;
  undefined4 local_264;
  Option local_260 [128];
  string asStack_1e0 [120];
  cat local_168;
  char (*local_160) [1];
  StringRef local_158;
  value_desc local_148;
  StringRef local_138;
  desc local_128 [9];
  string asStack_98 [126];
  byte local_1a;
  byte local_19;
  char **local_18;
  int local_c;
  
  local_19 = in_CL & 1;
  local_1a = in_R8B & 1;
  pSVar29 = in_RDI;
  local_18 = in_RDX;
  local_c = in_ESI;
  llvm::StringRef::StringRef(in_stack_ffffffffffffd7c0,(char *)in_stack_ffffffffffffd7b8);
  llvm::cl::desc::desc(local_128,local_138);
  llvm::StringRef::StringRef(in_stack_ffffffffffffd7c0,(char *)in_stack_ffffffffffffd7b8);
  llvm::cl::value_desc::value_desc(&local_148,local_158);
  local_160 = (char (*) [1])llvm::cl::init<char[1]>(in_stack_ffffffffffffd7a8);
  llvm::cl::cat::cat(&local_168,&SlicingOpts);
  llvm::cl::opt<std::__cxx11::string,false,llvm::cl::parser<std::__cxx11::string>>::
  opt<char[2],llvm::cl::desc,llvm::cl::value_desc,llvm::cl::initializer<char[1]>,llvm::cl::cat>
            ((opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffd7e0,(char (*) [2])in_stack_ffffffffffffd7d8,
             (desc *)in_stack_ffffffffffffd7d0,in_stack_ffffffffffffd7c8,
             (initializer<char[1]> *)in_stack_ffffffffffffd7c0,in_stack_ffffffffffffd7b8);
  local_264 = 1;
  llvm::StringRef::StringRef(in_stack_ffffffffffffd7c0,(char *)in_stack_ffffffffffffd7b8);
  llvm::cl::desc::desc(&local_278,local_288);
  local_290 = (char (*) [1])llvm::cl::init<char[1]>(in_stack_ffffffffffffd7a8);
  llvm::cl::cat::cat(&local_298,&SlicingOpts);
  llvm::cl::opt<std::__cxx11::string,false,llvm::cl::parser<std::__cxx11::string>>::
  opt<llvm::cl::FormattingFlags,llvm::cl::desc,llvm::cl::initializer<char[1]>,llvm::cl::cat>
            ((opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffd7d0,(FormattingFlags *)in_stack_ffffffffffffd7c8,
             (desc *)in_stack_ffffffffffffd7c0,(initializer<char[1]> *)in_stack_ffffffffffffd7b8,
             in_stack_ffffffffffffd7b0);
  if ((local_1a & 1) != 0) {
    llvm::cl::Option::setNumOccurrencesFlag(local_260,Required);
  }
  llvm::StringRef::StringRef(in_stack_ffffffffffffd7c0,(char *)in_stack_ffffffffffffd7b8);
  llvm::cl::desc::desc(&local_3a0,local_3b0);
  llvm::StringRef::StringRef(in_stack_ffffffffffffd7c0,(char *)in_stack_ffffffffffffd7b8);
  llvm::cl::value_desc::value_desc(&local_3c0,local_3d0);
  local_3d8 = (char (*) [1])llvm::cl::init<char[1]>(in_stack_ffffffffffffd7a8);
  llvm::cl::cat::cat(&local_3e0,&SlicingOpts);
  llvm::cl::opt<std::__cxx11::string,false,llvm::cl::parser<std::__cxx11::string>>::
  opt<char[3],llvm::cl::desc,llvm::cl::value_desc,llvm::cl::initializer<char[1]>,llvm::cl::cat>
            ((opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffd7e0,(char (*) [3])in_stack_ffffffffffffd7d8,
             (desc *)in_stack_ffffffffffffd7d0,in_stack_ffffffffffffd7c8,
             (initializer<char[1]> *)in_stack_ffffffffffffd7c0,in_stack_ffffffffffffd7b8);
  llvm::StringRef::StringRef(in_stack_ffffffffffffd7c0,(char *)in_stack_ffffffffffffd7b8);
  llvm::cl::desc::desc(&local_4e8,local_4f8);
  llvm::StringRef::StringRef(in_stack_ffffffffffffd7c0,(char *)in_stack_ffffffffffffd7b8);
  llvm::cl::value_desc::value_desc(&local_508,local_518);
  local_520 = (char (*) [1])llvm::cl::init<char[1]>(in_stack_ffffffffffffd7a8);
  llvm::cl::cat::cat(&local_528,&SlicingOpts);
  llvm::cl::opt<std::__cxx11::string,false,llvm::cl::parser<std::__cxx11::string>>::
  opt<char[2],llvm::cl::desc,llvm::cl::value_desc,llvm::cl::initializer<char[1]>,llvm::cl::cat>
            ((opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffd7e0,(char (*) [2])in_stack_ffffffffffffd7d8,
             (desc *)in_stack_ffffffffffffd7d0,in_stack_ffffffffffffd7c8,
             (initializer<char[1]> *)in_stack_ffffffffffffd7c0,in_stack_ffffffffffffd7b8);
  llvm::StringRef::StringRef(in_stack_ffffffffffffd7c0,(char *)in_stack_ffffffffffffd7b8);
  llvm::cl::desc::desc(local_630,local_640);
  llvm::StringRef::StringRef(in_stack_ffffffffffffd7c0,(char *)in_stack_ffffffffffffd7b8);
  llvm::cl::value_desc::value_desc(&local_650,local_660);
  local_668 = (char (*) [1])llvm::cl::init<char[1]>(in_stack_ffffffffffffd7a8);
  llvm::cl::cat::cat(&local_670,&SlicingOpts);
  llvm::cl::opt<std::__cxx11::string,false,llvm::cl::parser<std::__cxx11::string>>::
  opt<char[3],llvm::cl::desc,llvm::cl::value_desc,llvm::cl::initializer<char[1]>,llvm::cl::cat>
            ((opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffd7e0,(char (*) [3])in_stack_ffffffffffffd7d8,
             (desc *)in_stack_ffffffffffffd7d0,in_stack_ffffffffffffd7c8,
             (initializer<char[1]> *)in_stack_ffffffffffffd7c0,in_stack_ffffffffffffd7b8);
  llvm::StringRef::StringRef(in_stack_ffffffffffffd7c0,(char *)in_stack_ffffffffffffd7b8);
  llvm::cl::desc::desc(local_740,local_750);
  local_759 = 0;
  local_758 = (bool *)llvm::cl::init<bool>((bool *)in_stack_ffffffffffffd7a8);
  llvm::cl::cat::cat(&local_768,&SlicingOpts);
  llvm::cl::opt<bool,false,llvm::cl::parser<bool>>::
  opt<char[24],llvm::cl::desc,llvm::cl::initializer<bool>,llvm::cl::cat>
            (in_stack_ffffffffffffd7d0,(char (*) [24])in_stack_ffffffffffffd7c8,
             (desc *)in_stack_ffffffffffffd7c0,(initializer<bool> *)in_stack_ffffffffffffd7b8,
             in_stack_ffffffffffffd7b0);
  llvm::StringRef::StringRef(in_stack_ffffffffffffd7c0,(char *)in_stack_ffffffffffffd7b8);
  llvm::cl::desc::desc(local_870,local_880);
  llvm::StringRef::StringRef(in_stack_ffffffffffffd7c0,(char *)in_stack_ffffffffffffd7b8);
  llvm::cl::value_desc::value_desc(&local_890,local_8a0);
  local_8a8 = (char (*) [1])llvm::cl::init<char[1]>(in_stack_ffffffffffffd7a8);
  llvm::cl::cat::cat(&local_8b0,&SlicingOpts);
  llvm::cl::opt<std::__cxx11::string,false,llvm::cl::parser<std::__cxx11::string>>::
  opt<char[20],llvm::cl::desc,llvm::cl::value_desc,llvm::cl::initializer<char[1]>,llvm::cl::cat>
            ((opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffd7e0,in_stack_ffffffffffffd7d8,
             (desc *)in_stack_ffffffffffffd7d0,in_stack_ffffffffffffd7c8,
             (initializer<char[1]> *)in_stack_ffffffffffffd7c0,in_stack_ffffffffffffd7b8);
  llvm::StringRef::StringRef(in_stack_ffffffffffffd7c0,(char *)in_stack_ffffffffffffd7b8);
  llvm::cl::desc::desc(&local_980,local_990);
  local_999 = 1;
  local_998 = (bool *)llvm::cl::init<bool>((bool *)in_stack_ffffffffffffd7a8);
  llvm::cl::cat::cat(&local_9a8,&SlicingOpts);
  llvm::cl::opt<bool,false,llvm::cl::parser<bool>>::
  opt<char[13],llvm::cl::desc,llvm::cl::initializer<bool>,llvm::cl::cat>
            (in_stack_ffffffffffffd7d0,(char (*) [13])in_stack_ffffffffffffd7c8,
             (desc *)in_stack_ffffffffffffd7c0,(initializer<bool> *)in_stack_ffffffffffffd7b8,
             in_stack_ffffffffffffd7b0);
  llvm::StringRef::StringRef(in_stack_ffffffffffffd7c0,(char *)in_stack_ffffffffffffd7b8);
  llvm::cl::desc::desc(local_a78,local_a88);
  local_a91 = 0;
  local_a90 = (bool *)llvm::cl::init<bool>((bool *)in_stack_ffffffffffffd7a8);
  llvm::cl::cat::cat(&local_aa0,&SlicingOpts);
  llvm::cl::opt<bool,false,llvm::cl::parser<bool>>::
  opt<char[13],llvm::cl::desc,llvm::cl::initializer<bool>,llvm::cl::cat>
            (in_stack_ffffffffffffd7d0,(char (*) [13])in_stack_ffffffffffffd7c8,
             (desc *)in_stack_ffffffffffffd7c0,(initializer<bool> *)in_stack_ffffffffffffd7b8,
             in_stack_ffffffffffffd7b0);
  llvm::StringRef::StringRef(in_stack_ffffffffffffd7c0,(char *)in_stack_ffffffffffffd7b8);
  llvm::cl::desc::desc(local_b70,local_b80);
  local_b89 = 0;
  local_b88 = (bool *)llvm::cl::init<bool>((bool *)in_stack_ffffffffffffd7a8);
  llvm::cl::cat::cat(&local_b98,&SlicingOpts);
  llvm::cl::opt<bool,false,llvm::cl::parser<bool>>::
  opt<char[9],llvm::cl::desc,llvm::cl::initializer<bool>,llvm::cl::cat>
            (in_stack_ffffffffffffd7d0,(char (*) [9])in_stack_ffffffffffffd7c8,
             (desc *)in_stack_ffffffffffffd7c0,(initializer<bool> *)in_stack_ffffffffffffd7b8,
             in_stack_ffffffffffffd7b0);
  llvm::StringRef::StringRef(in_stack_ffffffffffffd7c0,(char *)in_stack_ffffffffffffd7b8);
  llvm::cl::desc::desc(local_c70,local_c80);
  llvm::StringRef::StringRef(in_stack_ffffffffffffd7c0,(char *)in_stack_ffffffffffffd7b8);
  llvm::cl::value_desc::value_desc(&local_c90,local_ca0);
  local_ca8 = (unsigned_long *)
              llvm::cl::init<unsigned_long>((unsigned_long *)in_stack_ffffffffffffd7a8);
  llvm::cl::cat::cat(&local_cb0,&SlicingOpts);
  llvm::cl::opt<unsigned_long,false,llvm::cl::parser<unsigned_long>>::
  opt<char[20],llvm::cl::desc,llvm::cl::value_desc,llvm::cl::initializer<unsigned_long>,llvm::cl::cat>
            (in_stack_ffffffffffffd7e0,in_stack_ffffffffffffd7d8,(desc *)in_stack_ffffffffffffd7d0,
             in_stack_ffffffffffffd7c8,(initializer<unsigned_long> *)in_stack_ffffffffffffd7c0,
             in_stack_ffffffffffffd7b8);
  llvm::StringRef::StringRef(in_stack_ffffffffffffd7c0,(char *)in_stack_ffffffffffffd7b8);
  llvm::cl::desc::desc(local_f18,local_f28);
  llvm::StringRef::StringRef(in_stack_ffffffffffffd7c0,(char *)in_stack_ffffffffffffd7b8);
  local_ff0 = 0;
  llvm::StringRef::StringRef(in_stack_ffffffffffffd7c0,(char *)in_stack_ffffffffffffd7b8);
  llvm::StringRef::StringRef(in_stack_ffffffffffffd7c0,(char *)in_stack_ffffffffffffd7b8);
  local_1018 = 1;
  llvm::StringRef::StringRef(in_stack_ffffffffffffd7c0,(char *)in_stack_ffffffffffffd7b8);
  llvm::StringRef::StringRef(in_stack_ffffffffffffd7c0,(char *)in_stack_ffffffffffffd7b8);
  local_1040 = 2;
  llvm::StringRef::StringRef(in_stack_ffffffffffffd7c0,(char *)in_stack_ffffffffffffd7b8);
  llvm::StringRef::StringRef(in_stack_ffffffffffffd7c0,(char *)in_stack_ffffffffffffd7b8);
  local_1068 = 3;
  llvm::StringRef::StringRef(in_stack_ffffffffffffd7c0,(char *)in_stack_ffffffffffffd7b8);
  llvm::StringRef::StringRef(in_stack_ffffffffffffd7c0,(char *)in_stack_ffffffffffffd7b8);
  local_1090 = 4;
  llvm::StringRef::StringRef(in_stack_ffffffffffffd7c0,(char *)in_stack_ffffffffffffd7b8);
  llvm::StringRef::StringRef(in_stack_ffffffffffffd7c0,(char *)in_stack_ffffffffffffd7b8);
  local_10b8 = 8;
  llvm::StringRef::StringRef(in_stack_ffffffffffffd7c0,(char *)in_stack_ffffffffffffd7b8);
  llvm::StringRef::StringRef(in_stack_ffffffffffffd7c0,(char *)in_stack_ffffffffffffd7b8);
  local_10e0 = 0xc;
  llvm::StringRef::StringRef(in_stack_ffffffffffffd7c0,(char *)in_stack_ffffffffffffd7b8);
  sVar26 = CONCAT44(uStack_10dc,local_10e0);
  sVar21 = CONCAT44(uStack_10b4,local_10b8);
  this_01 = (opt<dg::dda::UndefinedFunsBehavior,_false,_llvm::cl::parser<dg::dda::UndefinedFunsBehavior>_>
             *)CONCAT44(uStack_1014,local_1018);
  pcVar10 = (cat *)CONCAT44(uStack_fec,local_ff0);
  Options_01.Name.Length = in_stack_ffffffffffffd928;
  Options_01.Name.Data = (char *)in_stack_ffffffffffffd920;
  Options_01._16_8_ = in_stack_ffffffffffffd930;
  Options_01.Description.Data = (char *)in_stack_ffffffffffffd938;
  Options_01.Description.Length = in_stack_ffffffffffffd940;
  Options_1_00.Name.Length = in_stack_ffffffffffffd950;
  Options_1_00.Name.Data = (char *)in_stack_ffffffffffffd948;
  Options_1_00._16_8_ = in_stack_ffffffffffffd958;
  Options_1_00.Description.Data = (char *)in_stack_ffffffffffffd960;
  Options_1_00.Description.Length = in_stack_ffffffffffffd968;
  Options_2_00.Name.Length = in_stack_ffffffffffffd978;
  Options_2_00.Name.Data = (char *)in_stack_ffffffffffffd970;
  Options_2_00._16_8_ = in_stack_ffffffffffffd980;
  Options_2_00.Description.Data = (char *)in_stack_ffffffffffffd988;
  Options_2_00.Description.Length._0_4_ = in_stack_ffffffffffffd990;
  Options_2_00.Description.Length._4_4_ = in_stack_ffffffffffffd994;
  Options_3.Name.Length = in_stack_ffffffffffffd9a0;
  Options_3.Name.Data = &stack0xffffffffffffd7a8;
  Options_3._16_8_ = in_stack_ffffffffffffd9a8;
  Options_3.Description.Data._0_4_ = in_stack_ffffffffffffd9b0;
  Options_3.Description.Data._4_4_ = in_stack_ffffffffffffd9b4;
  Options_3.Description.Length = in_stack_ffffffffffffd9b8;
  Options_4.Name.Length = (size_t)pSVar29;
  Options_4.Name.Data = (char *)in_RDI;
  Options_4._16_8_ = in_stack_ffffffffffffd9d0.offset;
  Options_4.Description.Data = (char *)in_stack_ffffffffffffd9d8;
  Options_4.Description.Length = in_stack_ffffffffffffd9e0;
  Options_5.Name.Length = in_stack_ffffffffffffd9f0;
  Options_5.Name.Data = in_stack_ffffffffffffd9e8;
  Options_5.Value = in_stack_ffffffffffffd9f8._0_4_;
  Options_5._20_4_ = in_stack_ffffffffffffd9f8._4_4_;
  Options_5.Description.Data = (char *)SUB168(in_stack_ffffffffffffd9f8._8_16_,0);
  Options_5.Description.Length = SUB168(in_stack_ffffffffffffd9f8._8_16_,8);
  Options_6.Name.Data._7_1_ = in_stack_ffffffffffffda17;
  Options_6.Name.Data._0_7_ = in_stack_ffffffffffffda10;
  Options_6._8_16_ = in_stack_ffffffffffffda18;
  Options_6.Description._0_15_ = in_stack_ffffffffffffda28;
  Options_6.Description.Length._7_1_ = in_stack_ffffffffffffda37;
  Val = local_1000;
  Ms_3 = pcStack_ff8;
  pSVar11 = pSStack_fe8;
  pVVar12 = local_fe0;
  this_00 = local_1028;
  Ms = pacStack_1020;
  sVar19 = local_1078;
  uVar15 = uStack_1088;
  uVar17 = local_1080;
  uVar18 = local_10c8;
  uVar20 = uStack_10c0;
  uVar22 = uStack_10b0;
  uVar23 = local_10a8;
  uVar24 = local_10f0;
  uVar25 = uStack_10e8;
  uVar27 = uStack_10d8;
  uVar28 = local_10d0;
  llvm::cl::
  values<llvm::cl::OptionEnumValue,llvm::cl::OptionEnumValue,llvm::cl::OptionEnumValue,llvm::cl::OptionEnumValue,llvm::cl::OptionEnumValue,llvm::cl::OptionEnumValue,llvm::cl::OptionEnumValue>
            (Options_01,Options_1_00,Options_2_00,Options_3,Options_4,Options_5,Options_6);
  local_10fc = 8;
  local_10f8 = (UndefinedFunsBehavior *)
               llvm::cl::init<dg::dda::UndefinedFunsBehavior>((UndefinedFunsBehavior *)Val);
  llvm::cl::cat::cat(&local_1108,&SlicingOpts);
  llvm::cl::
  opt<dg::dda::UndefinedFunsBehavior,false,llvm::cl::parser<dg::dda::UndefinedFunsBehavior>>::
  opt<char[15],llvm::cl::desc,llvm::cl::ValuesClass,llvm::cl::initializer<dg::dda::UndefinedFunsBehavior>,llvm::cl::cat>
            (this_01,Ms,(desc *)this_00,pVVar12,
             (initializer<dg::dda::UndefinedFunsBehavior> *)pSVar11,pcVar10);
  llvm::cl::ValuesClass::~ValuesClass((ValuesClass *)0x1b46bb);
  llvm::StringRef::StringRef(pSVar11,(char *)pcVar10);
  llvm::cl::desc::desc(local_1210,local_1220);
  local_1228 = (char (*) [5])llvm::cl::init<char[5]>(Val);
  llvm::cl::cat::cat(&local_1230,&SlicingOpts);
  llvm::cl::opt<std::__cxx11::string,false,llvm::cl::parser<std::__cxx11::string>>::
  opt<char[6],llvm::cl::desc,llvm::cl::initializer<char[5]>,llvm::cl::cat>
            (this_00,(char (*) [6])pVVar12,(desc *)pSVar11,(initializer<char[5]> *)pcVar10,Ms_3);
  llvm::StringRef::StringRef(pSVar11,(char *)pcVar10);
  llvm::cl::desc::desc(local_1300,local_1310);
  local_1319 = 0;
  local_1318 = (bool *)llvm::cl::init<bool>((bool *)Val);
  llvm::cl::cat::cat(&local_1328,&SlicingOpts);
  llvm::cl::opt<bool,false,llvm::cl::parser<bool>>::
  opt<char[8],llvm::cl::desc,llvm::cl::initializer<bool>,llvm::cl::cat>
            ((opt<bool,_false,_llvm::cl::parser<bool>_> *)this_00,(char (*) [8])pVVar12,
             (desc *)pSVar11,(initializer<bool> *)pcVar10,Ms_3);
  llvm::StringRef::StringRef(pSVar11,(char *)pcVar10);
  llvm::cl::desc::desc(local_13f8,local_1408);
  local_1411 = 0;
  local_1410 = (bool *)llvm::cl::init<bool>((bool *)Val);
  llvm::cl::cat::cat(&local_1420,&SlicingOpts);
  llvm::cl::opt<bool,false,llvm::cl::parser<bool>>::
  opt<char[17],llvm::cl::desc,llvm::cl::initializer<bool>,llvm::cl::cat>
            ((opt<bool,_false,_llvm::cl::parser<bool>_> *)this_00,(char (*) [17])pVVar12,
             (desc *)pSVar11,(initializer<bool> *)pcVar10,Ms_3);
  llvm::StringRef::StringRef(pSVar11,(char *)pcVar10);
  llvm::cl::desc::desc(local_14f0,local_1500);
  local_1509 = 1;
  local_1508 = (bool *)llvm::cl::init<bool>((bool *)Val);
  llvm::cl::cat::cat(&local_1518,&SlicingOpts);
  llvm::cl::opt<bool,false,llvm::cl::parser<bool>>::
  opt<char[13],llvm::cl::desc,llvm::cl::initializer<bool>,llvm::cl::cat>
            ((opt<bool,_false,_llvm::cl::parser<bool>_> *)this_00,(char (*) [13])pVVar12,
             (desc *)pSVar11,(initializer<bool> *)pcVar10,Ms_3);
  llvm::StringRef::StringRef(pSVar11,(char *)pcVar10);
  llvm::cl::desc::desc(local_1620,local_1630);
  llvm::cl::cat::cat(&local_1638,&SlicingOpts);
  llvm::cl::opt<std::__cxx11::string,false,llvm::cl::parser<std::__cxx11::string>>::
  opt<char[16],llvm::cl::desc,llvm::cl::cat>(this_00,(char (*) [16])pVVar12,(desc *)pSVar11,pcVar10)
  ;
  llvm::StringRef::StringRef(pSVar11,(char *)pcVar10);
  llvm::cl::desc::desc(local_18a0,local_18b0);
  llvm::StringRef::StringRef(pSVar11,(char *)pcVar10);
  local_1978 = 0;
  llvm::StringRef::StringRef(pSVar11,(char *)pcVar10);
  llvm::StringRef::StringRef(pSVar11,(char *)pcVar10);
  local_19a0 = 1;
  llvm::StringRef::StringRef(pSVar11,(char *)pcVar10);
  llvm::StringRef::StringRef(pSVar11,(char *)pcVar10);
  local_19c8 = 2;
  llvm::StringRef::StringRef(pSVar11,(char *)pcVar10);
  uVar16 = CONCAT44(uStack_19c4,local_19c8);
  this_02 = (opt<dg::DataDependenceAnalysisOptions::AnalysisType,_false,_llvm::cl::parser<dg::DataDependenceAnalysisOptions::AnalysisType>_>
             *)CONCAT44(uStack_199c,local_19a0);
  pcVar10 = (cat *)CONCAT44(uStack_1974,local_1978);
  Options_00.Name.Length = uVar17;
  Options_00.Name.Data = (char *)uVar15;
  Options_00._16_8_ = uVar18;
  Options_00.Description.Data = (char *)uVar20;
  Options_00.Description.Length = sVar21;
  Options_1.Name.Length = uVar23;
  Options_1.Name.Data = (char *)uVar22;
  Options_1._16_8_ = uVar24;
  Options_1.Description.Data = (char *)uVar25;
  Options_1.Description.Length = sVar26;
  Options_2.Name.Length = uVar28;
  Options_2.Name.Data = (char *)uVar27;
  Options_2._16_8_ = in_stack_ffffffffffffd8c0;
  Options_2.Description.Data = (char *)in_stack_ffffffffffffd8c8;
  Options_2.Description.Length = in_stack_ffffffffffffd8d0;
  pSVar11 = pSStack_1970;
  pVVar12 = local_1968;
  Ms_1 = local_19b0;
  pacVar14 = pacStack_19a8;
  uVar15 = uStack_19d0;
  uVar17 = uStack_19c0;
  uVar18 = local_19b8;
  llvm::cl::values<llvm::cl::OptionEnumValue,llvm::cl::OptionEnumValue,llvm::cl::OptionEnumValue>
            (Options_00,Options_1,Options_2);
  local_19e4 = 0;
  local_19e0 = (AnalysisType *)
               llvm::cl::init<dg::LLVMPointerAnalysisOptions::AnalysisType>(local_1988);
  llvm::cl::cat::cat(&local_19f0,&SlicingOpts);
  llvm::cl::
  opt<dg::LLVMPointerAnalysisOptions::AnalysisType,false,llvm::cl::parser<dg::LLVMPointerAnalysisOptions::AnalysisType>>
  ::
  opt<char[4],llvm::cl::desc,llvm::cl::ValuesClass,llvm::cl::initializer<dg::LLVMPointerAnalysisOptions::AnalysisType>,llvm::cl::cat>
            ((opt<dg::LLVMPointerAnalysisOptions::AnalysisType,_false,_llvm::cl::parser<dg::LLVMPointerAnalysisOptions::AnalysisType>_>
              *)this_02,pacVar14,Ms_1,pVVar12,
             (initializer<dg::LLVMPointerAnalysisOptions::AnalysisType> *)pSVar11,pcVar10);
  llvm::cl::ValuesClass::~ValuesClass((ValuesClass *)0x1b4b21);
  llvm::StringRef::StringRef(pSVar11,(char *)pcVar10);
  llvm::cl::desc::desc(local_1c58,local_1c68);
  llvm::StringRef::StringRef(pSVar11,(char *)pcVar10);
  local_1d30 = 0;
  llvm::StringRef::StringRef(pSVar11,(char *)pcVar10);
  pcVar10 = (cat *)CONCAT44(uStack_1d2c,local_1d30);
  Options.Name.Length = uVar16;
  Options.Name.Data = (char *)uVar15;
  Options._16_8_ = uVar17;
  Options.Description.Data = (char *)uVar18;
  Options.Description.Length = sVar19;
  pSVar11 = pSStack_1d28;
  pVVar12 = local_1d20;
  llvm::cl::values<llvm::cl::OptionEnumValue>(Options);
  local_1d4c = 0;
  local_1d48 = (AnalysisType *)
               llvm::cl::init<dg::DataDependenceAnalysisOptions::AnalysisType>(local_1d40);
  llvm::cl::cat::cat(&local_1d58,&SlicingOpts);
  llvm::cl::
  opt<dg::DataDependenceAnalysisOptions::AnalysisType,false,llvm::cl::parser<dg::DataDependenceAnalysisOptions::AnalysisType>>
  ::
  opt<char[4],llvm::cl::desc,llvm::cl::ValuesClass,llvm::cl::initializer<dg::DataDependenceAnalysisOptions::AnalysisType>,llvm::cl::cat>
            (this_02,pacVar14,Ms_1,pVVar12,
             (initializer<dg::DataDependenceAnalysisOptions::AnalysisType> *)pSVar11,pcVar10);
  llvm::cl::ValuesClass::~ValuesClass((ValuesClass *)0x1b4c31);
  llvm::StringRef::StringRef(pSVar11,(char *)pcVar10);
  llvm::cl::desc::desc(&local_1fc0,local_1fd0);
  llvm::StringRef::StringRef(pSVar11,(char *)pcVar10);
  local_2098 = 0;
  llvm::StringRef::StringRef(pSVar11,(char *)pcVar10);
  llvm::StringRef::StringRef(pSVar11,(char *)pcVar10);
  local_20c0 = 0;
  llvm::StringRef::StringRef(pSVar11,(char *)pcVar10);
  llvm::StringRef::StringRef(pSVar11,(char *)pcVar10);
  local_20e8 = 0;
  llvm::StringRef::StringRef(pSVar11,(char *)pcVar10);
  llvm::StringRef::StringRef(pSVar11,(char *)pcVar10);
  local_2110 = 5;
  llvm::StringRef::StringRef(pSVar11,(char *)pcVar10);
  llvm::StringRef::StringRef(pSVar11,(char *)pcVar10);
  local_2138 = 2;
  llvm::StringRef::StringRef(pSVar11,(char *)pcVar10);
  llvm::StringRef::StringRef(pSVar11,(char *)pcVar10);
  local_2160 = 3;
  llvm::StringRef::StringRef(pSVar11,(char *)pcVar10);
  llvm::StringRef::StringRef(pSVar11,(char *)pcVar10);
  local_2188 = 4;
  llvm::StringRef::StringRef(pSVar11,(char *)pcVar10);
  llvm::StringRef::StringRef(pSVar11,(char *)pcVar10);
  local_21b0 = 1;
  llvm::StringRef::StringRef(pSVar11,(char *)pcVar10);
  llvm::StringRef::StringRef(pSVar11,(char *)pcVar10);
  local_21d8 = 6;
  llvm::StringRef::StringRef(pSVar11,(char *)pcVar10);
  llvm::StringRef::StringRef(pSVar11,(char *)pcVar10);
  local_2200 = 7;
  llvm::StringRef::StringRef(pSVar11,(char *)pcVar10);
  llvm::StringRef::StringRef(pSVar11,(char *)pcVar10);
  local_2228 = 8;
  llvm::StringRef::StringRef(pSVar11,(char *)pcVar10);
  llvm::StringRef::StringRef(pSVar11,(char *)pcVar10);
  local_2250 = 9;
  llvm::StringRef::StringRef(pSVar11,(char *)pcVar10);
  allocationFuns_00 = (string *)CONCAT44(uStack_20e4,local_20e8);
  this_03 = (opt<dg::ControlDependenceAnalysisOptions::CDAlgorithm,_false,_llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>_>
             *)CONCAT44(uStack_20bc,local_20c0);
  __x = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)CONCAT44(uStack_2094,local_2098);
  Options_02.Name.Data._7_1_ = in_stack_ffffffffffffda17;
  Options_02.Name.Data._0_7_ = in_stack_ffffffffffffda10;
  Options_02._8_16_ = in_stack_ffffffffffffda18;
  Options_02.Description._0_15_ = in_stack_ffffffffffffda28;
  Options_02.Description.Length._7_1_ = in_stack_ffffffffffffda37;
  Options_1_01._8_16_ = in_stack_ffffffffffffda40;
  Options_1_01.Name.Data = (char *)in_stack_ffffffffffffda38;
  Options_1_01.Description = in_stack_ffffffffffffda50;
  Options_7.Name.Data._7_1_ = in_stack_ffffffffffffdb2f;
  Options_7.Name.Data._0_7_ = in_stack_ffffffffffffdb28;
  Options_7.Name.Length = in_stack_ffffffffffffdb30;
  Options_7._16_16_ = in_stack_ffffffffffffdb38;
  Options_7.Description.Length = (size_t)in_stack_ffffffffffffdb48;
  Val_00 = local_20a8;
  this = poStack_20a0;
  pSVar11 = pSStack_2090;
  pVVar12 = local_2088;
  pSVar13 = local_20d0;
  pacVar14 = pacStack_20c8;
  opt = psStack_20b8;
  dgOptions_00 = pLStack_20e0;
  llvm::cl::
  values<llvm::cl::OptionEnumValue,llvm::cl::OptionEnumValue,llvm::cl::OptionEnumValue,llvm::cl::OptionEnumValue,llvm::cl::OptionEnumValue,llvm::cl::OptionEnumValue,llvm::cl::OptionEnumValue,llvm::cl::OptionEnumValue,llvm::cl::OptionEnumValue,llvm::cl::OptionEnumValue,llvm::cl::OptionEnumValue,llvm::cl::OptionEnumValue>
            (Options_02,Options_1_01,in_stack_ffffffffffffda60,in_stack_ffffffffffffda88,
             in_stack_ffffffffffffdab0,in_stack_ffffffffffffdad8,in_stack_ffffffffffffdb00,Options_7
             ,in_stack_ffffffffffffdb50,in_stack_ffffffffffffdb78,in_stack_ffffffffffffdba0,
             in_stack_ffffffffffffdbc8);
  local_226c = 0;
  local_2268 = (CDAlgorithm *)
               llvm::cl::init<dg::ControlDependenceAnalysisOptions::CDAlgorithm>
                         ((CDAlgorithm *)Val_00);
  llvm::cl::cat::cat(&local_2278,&SlicingOpts);
  llvm::cl::
  opt<dg::ControlDependenceAnalysisOptions::CDAlgorithm,false,llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>>
  ::
  opt<char[4],llvm::cl::desc,llvm::cl::ValuesClass,llvm::cl::initializer<dg::ControlDependenceAnalysisOptions::CDAlgorithm>,llvm::cl::cat>
            (this_03,pacVar14,(desc *)pSVar13,pVVar12,
             (initializer<dg::ControlDependenceAnalysisOptions::CDAlgorithm> *)pSVar11,(cat *)__x);
  sep = (char)((ulong)this_03 >> 0x38);
  llvm::cl::ValuesClass::~ValuesClass((ValuesClass *)0x1b5180);
  llvm::StringRef::StringRef(pSVar11,(char *)__x);
  llvm::cl::desc::desc(local_2310,local_2320);
  llvm::cl::aliasopt::aliasopt(&local_2328,local_1fb0);
  llvm::cl::cat::cat(&local_2330,&SlicingOpts);
  llvm::cl::alias::alias<char[7],llvm::cl::desc,llvm::cl::aliasopt,llvm::cl::cat>
            ((alias *)pSVar13,(char (*) [7])pVVar12,(desc *)pSVar11,(aliasopt *)__x,(cat *)this);
  llvm::StringRef::StringRef(pSVar11,(char *)__x);
  llvm::cl::desc::desc(local_23c8,local_23d8);
  llvm::cl::aliasopt::aliasopt(&local_23e0,local_970);
  llvm::cl::cat::cat(&local_23e8,&SlicingOpts);
  llvm::cl::alias::alias<char[14],llvm::cl::desc,llvm::cl::aliasopt,llvm::cl::cat>
            ((alias *)pSVar13,(char (*) [14])pVVar12,(desc *)pSVar11,(aliasopt *)__x,(cat *)this);
  llvm::StringRef::StringRef(pSVar11,(char *)__x);
  llvm::cl::desc::desc((desc *)&stack0xffffffffffffdb48,in_stack_ffffffffffffdb38);
  llvm::cl::init<bool>(Val_00);
  llvm::cl::cat::cat((cat *)&stack0xffffffffffffdb20,&SlicingOpts);
  llvm::cl::opt<bool,false,llvm::cl::parser<bool>>::
  opt<char[17],llvm::cl::desc,llvm::cl::initializer<bool>,llvm::cl::cat>
            ((opt<bool,_false,_llvm::cl::parser<bool>_> *)pSVar13,(char (*) [17])pVVar12,
             (desc *)pSVar11,(initializer<bool> *)__x,(cat *)this);
  llvm::StringRef::StringRef(pSVar11,(char *)__x);
  llvm::cl::desc::desc((desc *)&stack0xffffffffffffda50,in_stack_ffffffffffffda40);
  llvm::cl::init<bool>(Val_00);
  llvm::cl::cat::cat((cat *)&stack0xffffffffffffda28,&SlicingOpts);
  llvm::cl::opt<bool,false,llvm::cl::parser<bool>>::
  opt<char[24],llvm::cl::desc,llvm::cl::initializer<bool>,llvm::cl::cat>
            ((opt<bool,_false,_llvm::cl::parser<bool>_> *)pSVar13,(char (*) [24])pVVar12,
             (desc *)pSVar11,(initializer<bool> *)__x,(cat *)this);
  pSVar9 = llvm::
           ManagedStatic<llvm::cl::SubCommand,_llvm::object_creator<llvm::cl::SubCommand>,_llvm::object_deleter<llvm::cl::SubCommand>_>
           ::operator*((ManagedStatic<llvm::cl::SubCommand,_llvm::object_creator<llvm::cl::SubCommand>,_llvm::object_deleter<llvm::cl::SubCommand>_>
                        *)this);
  llvm::cl::HideUnrelatedOptions(&SlicingOpts,pSVar9);
  llvm::StringRef::StringRef(pSVar11,(char *)__x);
  llvm::cl::ParseCommandLineOptions
            (local_c,local_18,in_stack_ffffffffffffda18,(raw_ostream *)0x0,(char *)0x0,false);
  if ((local_19 & 1) != 0) {
    iVar3 = llvm::cl::Option::getNumOccurrences(local_390);
    iVar4 = llvm::cl::Option::getNumOccurrences(local_4d8);
    if (iVar3 + iVar4 == 0) {
      llvm::errs();
      llvm::raw_ostream::operator<<((raw_ostream *)pSVar11,(char *)__x);
      exit(1);
    }
  }
  SlicerOptions::SlicerOptions(pSVar13);
  std::__cxx11::string::operator=((string *)&in_RDI->inputFile,asStack_1e0);
  std::__cxx11::string::operator=((string *)&in_RDI->outputFile,asStack_98);
  std::__cxx11::string::operator=((string *)&in_RDI->slicingCriteria,asStack_310);
  std::__cxx11::string::operator=((string *)&in_RDI->legacySlicingCriteria,asStack_458);
  std::__cxx11::string::operator=((string *)&in_RDI->legacySecondarySlicingCriteria,asStack_5a0);
  splitList(opt,sep);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)pSVar11,__x);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)pSVar11);
  bVar1 = llvm::cl::opt_storage::operator_cast_to_bool((opt_storage<bool,_false,_false> *)0x1b55a7);
  in_RDI->removeSlicingCriteria = bVar1;
  bVar1 = llvm::cl::opt_storage::operator_cast_to_bool((opt_storage<bool,_false,_false> *)0x1b55ce);
  in_RDI->forwardSlicing = bVar1;
  bVar1 = llvm::cl::opt_storage::operator_cast_to_bool((opt_storage<bool,_false,_false> *)0x1b55f5);
  in_RDI->cutoffDiverging = bVar1;
  bVar1 = llvm::cl::opt_storage::operator_cast_to_bool((opt_storage<bool,_false,_false> *)0x1b561c);
  in_RDI->criteriaAreNextInstr = bVar1;
  this_05 = (string *)&(in_RDI->dgOptions).DDAOptions;
  this_04 = &(in_RDI->dgOptions).CDAOptions;
  pSVar13 = in_RDI;
  std::__cxx11::string::operator=((string *)&(in_RDI->dgOptions).entryFunction,asStack_1180);
  bVar1 = llvm::cl::opt_storage::operator_cast_to_bool((opt_storage<bool,_false,_false> *)0x1b56a8);
  (pSVar13->dgOptions).preserveDbg = bVar1;
  bVar1 = llvm::cl::opt_storage::operator_cast_to_bool((opt_storage<bool,_false,_false> *)0x1b56cf);
  (pSVar13->dgOptions).threads = bVar1;
  CVar5 = llvm::cl::opt_storage::operator_cast_to_CDAlgorithm
                    ((opt_storage<dg::ControlDependenceAnalysisOptions::CDAlgorithm,_false,_false> *
                     )0x1b56f6);
  (this_04->super_ControlDependenceAnalysisOptions).algorithm = CVar5;
  bVar1 = llvm::cl::opt_storage::operator_cast_to_bool((opt_storage<bool,_false,_false> *)0x1b5717);
  (this_04->super_ControlDependenceAnalysisOptions).interprocedural = bVar1;
  bVar1 = llvm::cl::opt_storage::operator_cast_to_bool((opt_storage<bool,_false,_false> *)0x1b573b);
  (this_04->super_ControlDependenceAnalysisOptions).field_0x3e = bVar1;
  bVar1 = llvm::cl::opt_storage::operator_cast_to_bool((opt_storage<bool,_false,_false> *)0x1b576f);
  dg::LLVMControlDependenceAnalysisOptions::setNodePerInstruction(this_04,bVar1);
  addAllocationFuns(dgOptions_00,allocationFuns_00);
  std::__cxx11::string::operator=((string *)in_RDI,asStack_1180);
  o = llvm::cl::opt_storage::operator_cast_to_unsigned_long
                ((opt_storage<unsigned_long,_false,_false> *)0x1b57ce);
  dg::Offset::Offset((Offset *)&stack0xffffffffffffd9d0,o);
  dg::Offset::operator=
            ((Offset *)&(in_RDI->dgOptions).PTAOptions.super_PointerAnalysisOptions,
             in_stack_ffffffffffffd9d0);
  AVar6 = llvm::cl::opt_storage::operator_cast_to_AnalysisType
                    ((opt_storage<dg::LLVMPointerAnalysisOptions::AnalysisType,_false,_false> *)
                     0x1b580b);
  (in_RDI->dgOptions).PTAOptions.analysisType = AVar6;
  bVar1 = llvm::cl::opt_storage::operator_cast_to_bool((opt_storage<bool,_false,_false> *)0x1b582c);
  (in_RDI->dgOptions).PTAOptions.threads = bVar1;
  sVar2 = (string)llvm::cl::opt_storage::operator_cast_to_bool
                            ((opt_storage<bool,_false,_false> *)0x1b5850);
  this_05[0x98] = sVar2;
  std::__cxx11::string::operator=(this_05,asStack_1180);
  UVar7 = llvm::cl::opt_storage::operator_cast_to_UndefinedFunsBehavior
                    ((opt_storage<dg::dda::UndefinedFunsBehavior,_false,_false> *)0x1b5893);
  *(UndefinedFunsBehavior *)(this_05 + 0x5c) = UVar7;
  AVar8 = llvm::cl::opt_storage::operator_cast_to_AnalysisType
                    ((opt_storage<dg::DataDependenceAnalysisOptions::AnalysisType,_false,_false> *)
                     0x1b58b4);
  *(AnalysisType *)(this_05 + 0x58) = AVar8;
  llvm::cl::opt<bool,_false,_llvm::cl::parser<bool>_>::~opt
            ((opt<bool,_false,_llvm::cl::parser<bool>_> *)this);
  llvm::cl::opt<bool,_false,_llvm::cl::parser<bool>_>::~opt
            ((opt<bool,_false,_llvm::cl::parser<bool>_> *)this);
  llvm::cl::alias::~alias((alias *)0x1b5907);
  llvm::cl::alias::~alias((alias *)0x1b5914);
  llvm::cl::
  opt<dg::ControlDependenceAnalysisOptions::CDAlgorithm,_false,_llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>_>
  ::~opt(this);
  llvm::cl::
  opt<dg::DataDependenceAnalysisOptions::AnalysisType,_false,_llvm::cl::parser<dg::DataDependenceAnalysisOptions::AnalysisType>_>
  ::~opt((opt<dg::DataDependenceAnalysisOptions::AnalysisType,_false,_llvm::cl::parser<dg::DataDependenceAnalysisOptions::AnalysisType>_>
          *)this);
  llvm::cl::
  opt<dg::LLVMPointerAnalysisOptions::AnalysisType,_false,_llvm::cl::parser<dg::LLVMPointerAnalysisOptions::AnalysisType>_>
  ::~opt((opt<dg::LLVMPointerAnalysisOptions::AnalysisType,_false,_llvm::cl::parser<dg::LLVMPointerAnalysisOptions::AnalysisType>_>
          *)this);
  llvm::cl::
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~opt((opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)this);
  llvm::cl::opt<bool,_false,_llvm::cl::parser<bool>_>::~opt
            ((opt<bool,_false,_llvm::cl::parser<bool>_> *)this);
  llvm::cl::opt<bool,_false,_llvm::cl::parser<bool>_>::~opt
            ((opt<bool,_false,_llvm::cl::parser<bool>_> *)this);
  llvm::cl::opt<bool,_false,_llvm::cl::parser<bool>_>::~opt
            ((opt<bool,_false,_llvm::cl::parser<bool>_> *)this);
  llvm::cl::
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~opt((opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)this);
  llvm::cl::
  opt<dg::dda::UndefinedFunsBehavior,_false,_llvm::cl::parser<dg::dda::UndefinedFunsBehavior>_>::
  ~opt((opt<dg::dda::UndefinedFunsBehavior,_false,_llvm::cl::parser<dg::dda::UndefinedFunsBehavior>_>
        *)this);
  llvm::cl::opt<unsigned_long,_false,_llvm::cl::parser<unsigned_long>_>::~opt
            ((opt<unsigned_long,_false,_llvm::cl::parser<unsigned_long>_> *)this);
  llvm::cl::opt<bool,_false,_llvm::cl::parser<bool>_>::~opt
            ((opt<bool,_false,_llvm::cl::parser<bool>_> *)this);
  llvm::cl::opt<bool,_false,_llvm::cl::parser<bool>_>::~opt
            ((opt<bool,_false,_llvm::cl::parser<bool>_> *)this);
  llvm::cl::opt<bool,_false,_llvm::cl::parser<bool>_>::~opt
            ((opt<bool,_false,_llvm::cl::parser<bool>_> *)this);
  llvm::cl::
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~opt((opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)this);
  llvm::cl::opt<bool,_false,_llvm::cl::parser<bool>_>::~opt
            ((opt<bool,_false,_llvm::cl::parser<bool>_> *)this);
  llvm::cl::
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~opt((opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)this);
  llvm::cl::
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~opt((opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)this);
  llvm::cl::
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~opt((opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)this);
  llvm::cl::
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~opt((opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)this);
  llvm::cl::
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~opt((opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)this);
  return pSVar29;
}

Assistant:

SlicerOptions parseSlicerOptions(int argc, char *argv[], bool requireCrit,
                                 bool inputFileRequired) {
    llvm::cl::opt<std::string> outputFile(
            "o",
            llvm::cl::desc(
                    "Save the output to given file. If not specified,\n"
                    "a .sliced suffix is used with the original module name."),
            llvm::cl::value_desc("filename"), llvm::cl::init(""),
            llvm::cl::cat(SlicingOpts));

    llvm::cl::opt<std::string> inputFile(
            llvm::cl::Positional, llvm::cl::desc("<input file>"),
            llvm::cl::init(""), llvm::cl::cat(SlicingOpts));

    if (inputFileRequired) {
        inputFile.setNumOccurrencesFlag(llvm::cl::Required);
    }

    llvm::cl::opt<std::string> slicingCriteria(
            "sc",
            llvm::cl::desc(
                    "Slicing criterion\n"
                    "S ::= file1,file2#line1,line2#[var1,fun1],[var2,fun2]\n"
                    "S[&S];S[&S]\n"),
            llvm::cl::value_desc("crit"), llvm::cl::init(""),
            llvm::cl::cat(SlicingOpts));

    llvm::cl::opt<std::string> legacySlicingCriteria(
            "c",
            llvm::cl::desc(
                    "Slice with respect to the call-sites of a given function\n"
                    "i. e.: '-c foo' or '-c __assert_fail'. Special value is a "
                    "'ret'\n"
                    "in which case the slice is taken with respect to the "
                    "return value\n"
                    "of the main function. Further, you can specify the "
                    "criterion as\n"
                    "l:v where l is the line in the original code and v is the "
                    "variable.\n"
                    "l must be empty when v is a global variable. For local "
                    "variables,\n"
                    "the variable v must be used on the line l.\n"
                    "You can use comma-separated list of more slicing "
                    "criteria,\n"
                    "e.g. -c foo,5:x,:glob\n"),
            llvm::cl::value_desc("crit"), llvm::cl::init(""),
            llvm::cl::cat(SlicingOpts));

    llvm::cl::opt<std::string> legacySecondarySlicingCriteria(
            "2c",
            llvm::cl::desc(
                    "Set secondary slicing criterion. The criterion is a call\n"
                    "to a given function. If just a name of the function is\n"
                    "given, it is a 'control' slicing criterion. If there is "
                    "()\n"
                    "appended, it is 'data' slicing criterion. E.g. foo means\n"
                    "control secondary slicing criterion, foo() means data\n"
                    "data secondary slicing criterion.\n"),
            llvm::cl::value_desc("crit"), llvm::cl::init(""),
            llvm::cl::cat(SlicingOpts));

    llvm::cl::opt<bool> removeSlicingCriteria(
            "remove-slicing-criteria",
            llvm::cl::desc(
                    "By default, slicer keeps also slicing criteria\n"
                    "in the sliced program. This switch makes slicer to "
                    "remove\n"
                    "also the criteria (i.e. behave like Weisser's algorithm)"),
            llvm::cl::init(false), llvm::cl::cat(SlicingOpts));

    llvm::cl::opt<std::string> preservedFuns(
            "preserved-functions",
            llvm::cl::desc(
                    "Do not slice bodies of the given functions.\n"
                    "The argument is a comma-separated list of functions.\n"),
            llvm::cl::value_desc("funs"), llvm::cl::init(""),
            llvm::cl::cat(SlicingOpts));

    llvm::cl::opt<bool> interprocCd(
            "interproc-cd",
            llvm::cl::desc(
                    "Compute interprocedural dependencies that cover, e.g.,\n"
                    "calls calls to exit() from inside of procedures. Default: "
                    "true.\n"),
            llvm::cl::init(true), llvm::cl::cat(SlicingOpts));

    llvm::cl::opt<bool> cdaPerInstr(
            "cda-per-inst",
            llvm::cl::desc("Compute control dependencies per instruction (the "
                           "default\n"
                           "is per basic block)\n"),
            llvm::cl::init(false), llvm::cl::cat(SlicingOpts));

    llvm::cl::opt<bool> icfgCD(
            "cda-icfg",
            llvm::cl::desc(
                    "Compute control dependencies on interprocedural CFG.\n"
                    "Default: false (interprocedral CD are computed by\n"
                    "a separate analysis.\n"),
            llvm::cl::init(false), llvm::cl::cat(SlicingOpts));

    llvm::cl::opt<uint64_t> ptaFieldSensitivity(
            "pta-field-sensitive",
            llvm::cl::desc("Make PTA field sensitive/insensitive. The offset "
                           "in a pointer\n"
                           "is cropped to Offset::UNKNOWN when it is greater "
                           "than N bytes.\n"
                           "Default is full field-sensitivity (N = "
                           "Offset::UNKNOWN).\n"),
            llvm::cl::value_desc("N"), llvm::cl::init(dg::Offset::UNKNOWN),
            llvm::cl::cat(SlicingOpts));

    llvm::cl::opt<dg::dda::UndefinedFunsBehavior> undefinedFunsBehavior(
            "undefined-funs",
            llvm::cl::desc("Set the behavior of undefined functions\n"),
            llvm::cl::values(
                    clEnumValN(dg::dda::PURE, "pure",
                               "Assume that undefined functions do not read "
                               "nor write memory"),
                    clEnumValN(dg::dda::WRITE_ANY, "write-any",
                               "Assume that undefined functions may write any "
                               "memory"),
                    clEnumValN(dg::dda::READ_ANY, "read-any",
                               "Assume that undefined functions may read any "
                               "memory"),
                    clEnumValN(dg::dda::READ_ANY | dg::dda::WRITE_ANY, "rw-any",
                               "Assume that undefined functions may read and "
                               "write any memory"),
                    clEnumValN(dg::dda::WRITE_ARGS, "write-args",
                               "Assume that undefined functions may write to "
                               "arguments"),
                    clEnumValN(dg::dda::READ_ARGS, "read-args",
                               "Assume that undefined functions may read from "
                               "arguments (default)"),
                    clEnumValN(dg::dda::WRITE_ARGS | dg::dda::READ_ARGS,
                               "rw-args",
                               "Assume that undefined functions may read or "
                               "write from/to arguments")
#if LLVM_VERSION_MAJOR < 4
                            ,
                    nullptr
#endif
                    ),
            llvm::cl::init(dg::dda::READ_ARGS), llvm::cl::cat(SlicingOpts));

    llvm::cl::opt<std::string> entryFunction(
            "entry", llvm::cl::desc("Entry function of the program\n"),
            llvm::cl::init("main"), llvm::cl::cat(SlicingOpts));

    llvm::cl::opt<bool> forwardSlicing(
            "forward", llvm::cl::desc("Perform forward slicing\n"),
            llvm::cl::init(false), llvm::cl::cat(SlicingOpts));

    llvm::cl::opt<bool> threads(
            "consider-threads",
            llvm::cl::desc(
                    "Consider threads are in input file (default=false)."),
            llvm::cl::init(false), llvm::cl::cat(SlicingOpts));

    llvm::cl::opt<bool> preserveDbg(
            "preserve-dbg",
            llvm::cl::desc("Preserve debugging information (default=true)."),
            llvm::cl::init(true), llvm::cl::cat(SlicingOpts));

    llvm::cl::opt<std::string> allocationFuns(
            "allocation-funs",
            llvm::cl::desc(
                    "Treat these functions as allocation functions\n"
                    "The argument is a comma-separated list of func:type,\n"
                    "where func is the function and type is one of\n"
                    "malloc, calloc, or realloc.\n"
                    "E.g., myAlloc:malloc will treat myAlloc as malloc.\n"),
            llvm::cl::cat(SlicingOpts));

    llvm::cl::opt<LLVMPointerAnalysisOptions::AnalysisType> ptaType(
            "pta", llvm::cl::desc("Choose pointer analysis to use:"),
            llvm::cl::values(
                    clEnumValN(LLVMPointerAnalysisOptions::AnalysisType::fi,
                               "fi", "Flow-insensitive PTA (default)"),
                    clEnumValN(LLVMPointerAnalysisOptions::AnalysisType::fs,
                               "fs", "Flow-sensitive PTA"),
                    clEnumValN(LLVMPointerAnalysisOptions::AnalysisType::inv,
                               "inv", "PTA with invalidate nodes")
#ifdef HAVE_SVF
                            ,
                    clEnumValN(LLVMPointerAnalysisOptions::AnalysisType::svf,
                               "svf", "Use pointer analysis from SVF project")
#endif
#if LLVM_VERSION_MAJOR < 4
                            ,
                    nullptr
#endif
                    ),
            llvm::cl::init(LLVMPointerAnalysisOptions::AnalysisType::fi),
            llvm::cl::cat(SlicingOpts));

    llvm::cl::opt<LLVMDataDependenceAnalysisOptions::AnalysisType> ddaType(
            "dda", llvm::cl::desc("Choose data dependence analysis to use:"),
            llvm::cl::values(
                    clEnumValN(LLVMDataDependenceAnalysisOptions::AnalysisType::
                                       ssa,
                               "ssa",
                               "MemorySSA DDA (the only option right now)")
#if LLVM_VERSION_MAJOR < 4
                            ,
                    nullptr
#endif
                    ),
            llvm::cl::init(
                    LLVMDataDependenceAnalysisOptions::AnalysisType::ssa),
            llvm::cl::cat(SlicingOpts));

    llvm::cl::opt<dg::ControlDependenceAnalysisOptions::CDAlgorithm>
            cdAlgorithm(
                    "cda",
                    llvm::cl::desc("Choose control dependencies algorithm:"),
                    llvm::cl::values(
                            clEnumValN(dg::ControlDependenceAnalysisOptions::
                                               CDAlgorithm::STANDARD,
                                       "standard",
                                       "Ferrante's algorithm (default)"),
                            clEnumValN(dg::ControlDependenceAnalysisOptions::
                                               CDAlgorithm::STANDARD,
                                       "classic", "Alias to \"standard\""),
                            clEnumValN(dg::ControlDependenceAnalysisOptions::
                                               CDAlgorithm::STANDARD,
                                       "scd", "Alias to \"standard\""),
                            clEnumValN(dg::ControlDependenceAnalysisOptions::
                                               CDAlgorithm::NTSCD,
                                       "ntscd",
                                       "Non-termination sensitive control "
                                       "dependencies algorithm"),
                            clEnumValN(dg::ControlDependenceAnalysisOptions::
                                               CDAlgorithm::NTSCD2,
                                       "ntscd2",
                                       "Non-termination sensitive control "
                                       "dependencies algorithm (a different "
                                       "implementation)"),
                            clEnumValN(dg::ControlDependenceAnalysisOptions::
                                               CDAlgorithm::NTSCD_RANGANATH,
                                       "ntscd-ranganath",
                                       "Non-termination sensitive control "
                                       "dependencies algorithm (the fixed "
                                       "version of the original Ranganath et "
                                       "al.'s algorithm)"),
                            clEnumValN(
                                    dg::ControlDependenceAnalysisOptions::
                                            CDAlgorithm::NTSCD_RANGANATH_ORIG,
                                    "ntscd-ranganath-orig",
                                    "Non-termination sensitive control "
                                    "dependencies algorithm (the original "
                                    "(wrong) Ranganath et al.'s algorithm)"),
                            clEnumValN(dg::ControlDependenceAnalysisOptions::
                                               CDAlgorithm::NTSCD_LEGACY,
                                       "ntscd-legacy",
                                       "Non-termination sensitive control "
                                       "dependencies algorithm (legacy "
                                       "implementation)"),
                            clEnumValN(dg::ControlDependenceAnalysisOptions::
                                               CDAlgorithm::DOD_RANGANATH,
                                       "dod-ranganath",
                                       "Decisive order dependencies algorithm "
                                       "by Ranganath et al. - fixed version "
                                       "(standalone - for debugging)"),
                            clEnumValN(dg::ControlDependenceAnalysisOptions::
                                               CDAlgorithm::DOD,
                                       "dod",
                                       "Decisive order dependencies algorithm "
                                       "(standalone - for debugging)"),
                            clEnumValN(dg::ControlDependenceAnalysisOptions::
                                               CDAlgorithm::DODNTSCD,
                                       "dod+ntscd", "NTSCD and DOD together"),
                            clEnumValN(dg::ControlDependenceAnalysisOptions::
                                               CDAlgorithm::STRONG_CC,
                                       "scc",
                                       "Use strong control closure algorithm")
#if LLVM_VERSION_MAJOR < 4
                                    ,
                            nullptr
#endif
                            ),
                    llvm::cl::init(dg::ControlDependenceAnalysisOptions::
                                           CDAlgorithm::STANDARD),
                    llvm::cl::cat(SlicingOpts));

    llvm::cl::alias cdAlgAlias(
            "cd-alg",
            llvm::cl::desc("Choose control dependencies algorithm to use"
                           "(this options is obsolete, it is alias to -cda):"),
            llvm::cl::aliasopt(cdAlgorithm), llvm::cl::cat(SlicingOpts));

    llvm::cl::alias cdaInterprocAlias(
            "cda-interproc", llvm::cl::desc("Alias to interproc-cd"),
            llvm::cl::aliasopt(interprocCd), llvm::cl::cat(SlicingOpts));

    llvm::cl::opt<bool> cutoffDiverging(
            "cutoff-diverging",
            llvm::cl::desc("Cutoff diverging paths. That is, call abort() on "
                           "those paths that may not reach the slicing "
                           "criterion (default=true)."),
            llvm::cl::init(true), llvm::cl::cat(SlicingOpts));

    llvm::cl::opt<bool> criteriaAreNextInstr(
            "criteria-are-next-instr",
            llvm::cl::desc(
                    "Assume that slicing criteria are not the call-sites\n"
                    "of the given function, but the instructions that\n"
                    "follow the call. I.e. the call is used just to mark\n"
                    "the instruction.\n"
                    "E.g. for 'crit' being set as the criterion, slicing "
                    "critera are all instructions that follow any call of "
                    "'crit'.\n"),
            llvm::cl::init(false), llvm::cl::cat(SlicingOpts));

    ////////////////////////////////////
    // ===-- End of the options --=== //
    ////////////////////////////////////

    // hide all options except ours options
    // this method is available since LLVM 3.7
#if ((LLVM_VERSION_MAJOR > 3) ||                                               \
     ((LLVM_VERSION_MAJOR == 3) && (LLVM_VERSION_MINOR >= 7)))
    llvm::cl::HideUnrelatedOptions(SlicingOpts);
#endif
    llvm::cl::ParseCommandLineOptions(argc, argv);

    if (requireCrit) {
        if (slicingCriteria.getNumOccurrences() +
                    legacySlicingCriteria.getNumOccurrences() ==
            0) {
            llvm::errs()
                    << "No slicing criteria specified (-sc or -c option)\n";
            std::exit(1);
        }
    }

    /// Fill the structure
    SlicerOptions options;

    options.inputFile = inputFile;
    options.outputFile = outputFile;
    options.slicingCriteria = slicingCriteria;
    options.legacySlicingCriteria = legacySlicingCriteria;
    options.legacySecondarySlicingCriteria = legacySecondarySlicingCriteria;
    options.preservedFunctions = splitList(preservedFuns);
    options.removeSlicingCriteria = removeSlicingCriteria;
    options.forwardSlicing = forwardSlicing;
    options.cutoffDiverging = cutoffDiverging;
    options.criteriaAreNextInstr = criteriaAreNextInstr;

    auto &dgOptions = options.dgOptions;
    auto &PTAOptions = dgOptions.PTAOptions;
    auto &DDAOptions = dgOptions.DDAOptions;
    auto &CDAOptions = dgOptions.CDAOptions;

    dgOptions.entryFunction = entryFunction;
    dgOptions.preserveDbg = preserveDbg;
    dgOptions.threads = threads;

    CDAOptions.algorithm = cdAlgorithm;
    CDAOptions.interprocedural = interprocCd;
    CDAOptions._icfg = icfgCD;
    CDAOptions.setNodePerInstruction(cdaPerInstr);

    addAllocationFuns(dgOptions, allocationFuns);

    PTAOptions.entryFunction = entryFunction;
    PTAOptions.fieldSensitivity = dg::Offset(ptaFieldSensitivity);
    PTAOptions.analysisType = ptaType;
    PTAOptions.threads = threads;

    DDAOptions.threads = threads;
    DDAOptions.entryFunction = entryFunction;
    DDAOptions.undefinedFunsBehavior = undefinedFunsBehavior;
    DDAOptions.analysisType = ddaType;

    return options;
}